

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim_rpc.hpp
# Opt level: O3

void __thiscall
nvim::NvimRPC::async_call<std::__cxx11::string,std::__cxx11::string,bool>
          (NvimRPC *this,string *method,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *u,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *u_1,bool *u_2)

{
  ulong uVar1;
  uint16_t val;
  uint uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__n;
  size_t __n_00;
  char d;
  Packer pk;
  sbuffer sbuf;
  undefined1 local_59;
  ulong local_58;
  packer<msgpack::v1::sbuffer> local_50;
  sbuffer local_48;
  
  __n = u_1;
  msgpack::v1::sbuffer::sbuffer(&local_48,0x2000);
  local_59 = 0x94;
  local_50.m_stream = &local_48;
  msgpack::v1::sbuffer::write(&local_48,(int)&local_59,(void *)0x1,(size_t)__n);
  local_59 = 0;
  msgpack::v1::sbuffer::write(&local_48,(int)&local_59,(void *)0x1,(size_t)__n);
  uVar1 = this->msgid_;
  __n_00 = uVar1 + 1;
  this->msgid_ = __n_00;
  if (uVar1 < 0x100) {
    if (uVar1 < 0x80) {
      local_59 = (char)uVar1;
      msgpack::v1::sbuffer::write(&local_48,(int)&local_59,(void *)0x1,__n_00);
    }
    else {
      local_59 = 0xcc;
      local_58 = CONCAT71(local_58._1_7_,(char)uVar1);
      msgpack::v1::sbuffer::write(&local_48,(int)&local_59,(void *)0x2,__n_00);
    }
  }
  else if (uVar1 < 0x10000) {
    local_59 = 0xcd;
    local_58 = CONCAT62(local_58._2_6_,(ushort)uVar1 << 8 | (ushort)uVar1 >> 8);
    msgpack::v1::sbuffer::write(&local_48,(int)&local_59,(void *)0x3,__n_00);
  }
  else {
    __n_00 = uVar1 >> 0x20;
    if (__n_00 == 0) {
      local_59 = 0xce;
      uVar2 = (uint)uVar1;
      local_58 = CONCAT44(local_58._4_4_,
                          uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                          uVar2 << 0x18);
      msgpack::v1::sbuffer::write(&local_48,(int)&local_59,(void *)0x5,0);
    }
    else {
      local_59 = 0xcf;
      local_58 = uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 |
                 (uVar1 & 0xff0000000000) >> 0x18 | (uVar1 & 0xff00000000) >> 8 |
                 (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 | (uVar1 & 0xff00) << 0x28 |
                 uVar1 << 0x38;
      msgpack::v1::sbuffer::write(&local_48,(int)&local_59,(void *)0x9,__n_00);
    }
  }
  msgpack::v1::adaptor::pack<std::__cxx11::string,void>::operator()(&local_59,&local_50,method);
  local_59 = 0x93;
  msgpack::v1::sbuffer::write(local_50.m_stream,(int)&local_59,(void *)0x1,__n_00);
  detail::pack<std::__cxx11::string,std::__cxx11::string,bool>(&local_50,u,u_1,u_2);
  Socket::write(&this->socket_,(int)local_48.m_data,(void *)local_48.m_size,(size_t)u_2);
  free(local_48.m_data);
  return;
}

Assistant:

void NvimRPC::async_call(const std::string &method, const U&...u) {
    msgpack::sbuffer sbuf;
    detail::Packer pk(&sbuf);
    pk.pack_array(4) << (uint64_t)REQUEST
                     << msgid_++
                     << method;

    pk.pack_array(sizeof...(u));
    detail::pack(pk, u...);

    socket_.write(sbuf.data(), sbuf.size(), 5);
}